

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chart.cpp
# Opt level: O3

string * __thiscall
Chart::renderSubTotal(string *__return_storage_ptr__,Chart *this,time_t total_work,string *padding)

{
  long lVar1;
  uint uVar2;
  ostream *poVar3;
  ostream *poVar4;
  int iVar5;
  stringstream out;
  char local_221;
  string local_220;
  Color local_200;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(padding->_M_dataplus)._M_p,padding->_M_string_length);
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"underline","");
  Color::Color(&local_200,&local_220);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"      ","");
  Color::colorize(&local_1d8,&local_200,&local_1f8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  local_221 = '\n';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_221,1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(padding->_M_dataplus)._M_p,padding->_M_string_length);
  lVar1 = *(long *)poVar3;
  *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x10) = 3;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar4 = poVar3 + lVar1;
  if (poVar3[lVar1 + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar4);
    poVar4[0xe1] = (ostream)0x1;
  }
  iVar5 = (int)(SUB168(SEXT816(total_work) * SEXT816(0x48d159e26af37c05),8) >> 10) -
          (SUB164(SEXT816(total_work) * SEXT816(0x48d159e26af37c05),0xc) >> 0x1f);
  poVar4[0xe0] = (ostream)0x20;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
  local_221 = ':';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_221,1);
  lVar1 = *(long *)poVar3;
  *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x10) = 2;
  lVar1 = *(long *)(lVar1 + -0x18);
  poVar4 = poVar3 + lVar1;
  if (poVar3[lVar1 + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar4);
    poVar4[0xe1] = (ostream)0x1;
  }
  iVar5 = (int)total_work + iVar5 * -0xe10;
  uVar2 = ((uint)((short)iVar5 * -0x7777) >> 0x10) + iVar5;
  poVar4[0xe0] = (ostream)0x30;
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(int)(short)(((short)uVar2 >> 5) + (short)((uVar2 & 0xffff) >> 0xf)));
  local_221 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_221,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Chart::renderSubTotal (
  time_t total_work,
  const std::string& padding)
{
  std::stringstream out;

  int hours = total_work / 3600;
  int minutes = (total_work % 3600) / 60;

  out << padding
      << Color ("underline").colorize ("      ")
      << '\n'
      << padding
      << std::setw (3) << std::setfill (' ') << hours
      << ':'
      << std::setw (2) << std::setfill ('0') << minutes
      << '\n';

  return out.str ();
}